

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_quantize_init(ggml_type type)

{
  int in_EDI;
  int in_stack_000000f4;
  ggml_type in_stack_00000114;
  
  ggml_critical_section_start();
  if (1 < in_EDI - 0x10U) {
    if (in_EDI == 0x12) {
      iq3xs_init_impl(in_stack_000000f4);
      goto LAB_00159852;
    }
    if (in_EDI != 0x13) {
      if (in_EDI == 0x15) {
        iq3xs_init_impl(in_stack_000000f4);
        goto LAB_00159852;
      }
      if ((in_EDI != 0x16) && (in_EDI != 0x1d)) goto LAB_00159852;
    }
  }
  iq2xs_init_impl(in_stack_00000114);
LAB_00159852:
  ggml_critical_section_end();
  return;
}

Assistant:

void ggml_quantize_init(enum ggml_type type) {
    ggml_critical_section_start();

    switch (type) {
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ2_S:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:   iq2xs_init_impl(type); break;
        case GGML_TYPE_IQ3_XXS: iq3xs_init_impl(256); break;
        case GGML_TYPE_IQ3_S:   iq3xs_init_impl(512); break;
        default: // nothing
            break;
    }

    ggml_critical_section_end();
}